

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O2

void __thiscall FNodeBuilder::ExtractMini(FNodeBuilder *this,FMiniBSP *bsp)

{
  TArray<vertex_t,_vertex_t> *this_00;
  TArray<subsector_t,_subsector_t> *this_01;
  TArray<node_t,_node_t> *this_02;
  TArray<seg_t,_seg_t> *this_03;
  double *pdVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  FPrivVert *pFVar6;
  node_t *pnVar7;
  subsector_t *psVar8;
  FPrivSeg *pFVar9;
  FLevel *pFVar10;
  vertex_t *pvVar11;
  seg_t *psVar12;
  sector_t_conflict *psVar13;
  vertex_t *pvVar14;
  int iVar15;
  USegPtr *pUVar16;
  glseg_t *pgVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  node_t *pnVar24;
  line_t_conflict *plVar25;
  side_t *psVar26;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> glsegs;
  
  bsp->bDirty = false;
  this_00 = &bsp->Verts;
  TArray<vertex_t,_vertex_t>::Resize(this_00,(this->Vertices).Count);
  uVar4 = (this->Vertices).Count;
  pFVar6 = (this->Vertices).Array;
  for (lVar18 = 0; (ulong)uVar4 << 4 != lVar18; lVar18 = lVar18 + 0x10) {
    uVar3 = *(undefined8 *)((long)&(pFVar6->super_FSimpleVert).x + lVar18);
    pdVar1 = (double *)((long)&(this_00->Array->p).X + lVar18);
    *pdVar1 = (double)(int)uVar3 * 1.52587890625e-05;
    pdVar1[1] = (double)(int)((ulong)uVar3 >> 0x20) * 1.52587890625e-05;
  }
  this_01 = &bsp->Subsectors;
  TArray<subsector_t,_subsector_t>::Resize(this_01,(this->Subsectors).Count);
  memset((bsp->Subsectors).Array,0,(ulong)(this->Subsectors).Count * 0x30);
  this_02 = &bsp->Nodes;
  TArray<node_t,_node_t>::Resize(this_02,(this->Nodes).Count);
  memcpy((bsp->Nodes).Array,(this->Nodes).Array,(ulong)(this->Nodes).Count * 0x48);
  lVar18 = 0x10;
  for (uVar20 = 0; uVar20 < (this->Nodes).Count; uVar20 = uVar20 + 1) {
    for (uVar21 = 1; -1 < (int)uVar21; uVar21 = (ulong)((int)uVar21 - 1)) {
      pnVar7 = this_02->Array;
      uVar4 = pnVar7[uVar20].field_6.intchildren[uVar21];
      if ((int)uVar4 < 0) {
        pnVar24 = (node_t *)((long)&this_01->Array[uVar4 & 0x7fffffff].sector + 1);
      }
      else {
        pnVar24 = pnVar7 + uVar4;
      }
      pnVar7[uVar20].field_6.children[uVar21] = pnVar24;
    }
    lVar19 = lVar18;
    for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
      for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
        *(float *)((long)&this_02->Array->x + lVar23 * 4 + lVar19) =
             (float)*(int *)((long)&this_02->Array->x + lVar23 * 4 + lVar19) * 1.5258789e-05;
      }
      lVar19 = lVar19 + 0x10;
    }
    lVar18 = lVar18 + 0x48;
  }
  if (this->GLNodes == true) {
    glsegs.Array = (glseg_t *)0x0;
    glsegs.Most = 0;
    glsegs.Count = 0;
    lVar18 = 0x28;
    for (uVar20 = 0; uVar20 < (this->Subsectors).Count; uVar20 = uVar20 + 1) {
      iVar15 = CloseSubsector(this,&glsegs,(int)uVar20,this_00->Array);
      psVar8 = (bsp->Subsectors).Array;
      *(int *)((long)&psVar8->sector + lVar18) = iVar15;
      *(seg_t **)((long)psVar8 + lVar18 + -0x10) = (bsp->Segs).Array + ((bsp->Segs).Count - iVar15);
      lVar18 = lVar18 + 0x30;
    }
    TArray<seg_t,_seg_t>::Resize(&bsp->Segs,glsegs.Count);
    pgVar17 = glsegs.Array;
    for (lVar18 = 0; ((ulong)glsegs._8_8_ >> 0x20) * 0x30 - lVar18 != 0; lVar18 = lVar18 + 0x30) {
      psVar12 = (bsp->Segs).Array;
      pvVar11 = (pgVar17->super_seg_t).v1;
      pvVar14 = (pgVar17->super_seg_t).v2;
      psVar26 = (pgVar17->super_seg_t).sidedef;
      plVar25 = (pgVar17->super_seg_t).linedef;
      psVar13 = (pgVar17->super_seg_t).backsector;
      puVar2 = (undefined8 *)((long)&psVar12->frontsector + lVar18);
      *puVar2 = (pgVar17->super_seg_t).frontsector;
      puVar2[1] = psVar13;
      puVar2 = (undefined8 *)((long)&psVar12->sidedef + lVar18);
      *puVar2 = psVar26;
      puVar2[1] = plVar25;
      puVar2 = (undefined8 *)((long)&psVar12->v1 + lVar18);
      *puVar2 = pvVar11;
      puVar2[1] = pvVar14;
      pgVar17 = pgVar17 + 1;
    }
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::~TArray(&glsegs);
  }
  else {
    memcpy((bsp->Subsectors).Array,(this->Subsectors).Array,(ulong)(this->Subsectors).Count * 0x30);
    this_03 = &bsp->Segs;
    TArray<seg_t,_seg_t>::Resize(this_03,(this->Segs).Count);
    uVar4 = (this->Segs).Count;
    pUVar16 = (this->SegList).Array;
    pFVar9 = (this->Segs).Array;
    pFVar10 = this->Level;
    for (lVar18 = 0; (ulong)uVar4 * 6 - lVar18 != 0; lVar18 = lVar18 + 6) {
      uVar5 = pUVar16->SegNum;
      psVar12 = this_03->Array;
      pvVar11 = this_00->Array;
      (&psVar12->v1)[lVar18] = pvVar11 + pFVar9[uVar5].v1;
      (&psVar12->v2)[lVar18] = pvVar11 + pFVar9[uVar5].v2;
      psVar13 = (&pFVar9[uVar5].frontsector)[1];
      (&psVar12->frontsector)[lVar18] = pFVar9[uVar5].frontsector;
      (&psVar12->frontsector + lVar18)[1] = psVar13;
      if ((long)pFVar9[uVar5].sidedef == -1) {
        plVar25 = (line_t_conflict *)0x0;
        psVar26 = (side_t *)0x0;
      }
      else {
        plVar25 = pFVar10->Lines + pFVar9[uVar5].linedef;
        psVar26 = pFVar10->Sides + pFVar9[uVar5].sidedef;
      }
      (&psVar12->linedef)[lVar18] = plVar25;
      (&psVar12->sidedef)[lVar18] = psVar26;
      pUVar16 = (USegPtr *)(&pUVar16->SegNum + 2);
    }
    uVar4 = (bsp->Subsectors).Count;
    for (lVar18 = 0; (ulong)uVar4 * 0x30 - lVar18 != 0; lVar18 = lVar18 + 0x30) {
      *(seg_t **)((long)&this_01->Array->firstline + lVar18) =
           this_03->Array + *(long *)((long)&this_01->Array->firstline + lVar18);
    }
  }
  return;
}

Assistant:

void FNodeBuilder::ExtractMini (FMiniBSP *bsp)
{
	unsigned int i;

	bsp->bDirty = false;
	bsp->Verts.Resize(Vertices.Size());
	for (i = 0; i < Vertices.Size(); ++i)
	{
		bsp->Verts[i].set(Vertices[i].x, Vertices[i].y);
	}

	bsp->Subsectors.Resize(Subsectors.Size());
	memset(&bsp->Subsectors[0], 0, Subsectors.Size() * sizeof(subsector_t));

	bsp->Nodes.Resize(Nodes.Size());
	memcpy(&bsp->Nodes[0], &Nodes[0], Nodes.Size()*sizeof(node_t));
	for (i = 0; i < Nodes.Size(); ++i)
	{
		D(Printf(PRINT_LOG, "Node %d:\n", i));
		// Go backwards because on 64-bit systems, both of the intchildren are
		// inside the first in-game child.
		for (int j = 1; j >= 0; --j)
		{
			if (bsp->Nodes[i].intchildren[j] & 0x80000000)
			{
				D(Printf(PRINT_LOG, "  subsector %d\n", bsp->Nodes[i].intchildren[j] & 0x7FFFFFFF));
				bsp->Nodes[i].children[j] = (BYTE *)&bsp->Subsectors[bsp->Nodes[i].intchildren[j] & 0x7fffffff] + 1;
			}
			else
			{
				D(Printf(PRINT_LOG, "  node %d\n", bsp->Nodes[i].intchildren[j]));
				bsp->Nodes[i].children[j] = &bsp->Nodes[bsp->Nodes[i].intchildren[j]];
			}
		}
		for (int j = 0; j < 2; ++j)
		{
			for (int k = 0; k < 4; ++k)
			{
				bsp->Nodes[i].bbox[j][k] = FIXED2FLOAT(bsp->Nodes[i].nb_bbox[j][k]);
			}
		}
	}

	if (GLNodes)
	{
		TArray<glseg_t> glsegs;
		for (i = 0; i < Subsectors.Size(); ++i)
		{
			DWORD numsegs = CloseSubsector (glsegs, i, &bsp->Verts[0]);
			bsp->Subsectors[i].numlines = numsegs;
			bsp->Subsectors[i].firstline = &bsp->Segs[bsp->Segs.Size() - numsegs];
		}
		bsp->Segs.Resize(glsegs.Size());
		for (i = 0; i < glsegs.Size(); ++i)
		{
			bsp->Segs[i] = *(seg_t *)&glsegs[i];
		}
	}
	else
	{
		memcpy(&bsp->Subsectors[0], &Subsectors[0], Subsectors.Size()*sizeof(subsector_t));
		bsp->Segs.Resize(Segs.Size());
		for (i = 0; i < Segs.Size(); ++i)
		{
			const FPrivSeg *org = &Segs[SegList[i].SegNum];
			seg_t *out = &bsp->Segs[i];

			D(Printf(PRINT_LOG, "Seg %d: v1(%d) -> v2(%d)\n", i, org->v1, org->v2));

			out->v1 = &bsp->Verts[org->v1];
			out->v2 = &bsp->Verts[org->v2];
			out->backsector = org->backsector;
			out->frontsector = org->frontsector;
			if (org->sidedef != int(NO_SIDE))
			{
				out->linedef = Level.Lines + org->linedef;
				out->sidedef = Level.Sides + org->sidedef;
			}
			else	// part of a miniseg
			{
				out->linedef = NULL;
				out->sidedef = NULL;
			}
		}
		for (i = 0; i < bsp->Subsectors.Size(); ++i)
		{
			bsp->Subsectors[i].firstline = &bsp->Segs[(size_t)bsp->Subsectors[i].firstline];
		}
	}
}